

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void Curl_updateconninfo(Curl_easy *data,connectdata *conn,curl_socket_t sockfd)

{
  int local_5c;
  char local_58 [4];
  int local_port;
  char local_ip [46];
  curl_socket_t sockfd_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  memset(local_58,0,0x2e);
  local_5c = -1;
  if (((*(uint *)&(conn->bits).field_0x4 >> 7 & 1) == 0) &&
     ((conn->transport != '\x03' || ((*(uint *)&(conn->bits).field_0x4 >> 0x19 & 1) == 0)))) {
    Curl_conninfo_remote(data,conn,sockfd);
  }
  Curl_conninfo_local(data,sockfd,local_58,&local_5c);
  Curl_persistconninfo(data,conn,local_58,local_5c);
  return;
}

Assistant:

void Curl_updateconninfo(struct Curl_easy *data, struct connectdata *conn,
                         curl_socket_t sockfd)
{
  /* 'local_ip' and 'local_port' get filled with local's numerical
     ip address and port number whenever an outgoing connection is
     **established** from the primary socket to a remote address. */
  char local_ip[MAX_IPADR_LEN] = "";
  int local_port = -1;

  if(!conn->bits.reuse &&
     (conn->transport != TRNSPRT_TCP || !conn->bits.tcp_fastopen))
    Curl_conninfo_remote(data, conn, sockfd);
  Curl_conninfo_local(data, sockfd, local_ip, &local_port);

  /* persist connection info in session handle */
  Curl_persistconninfo(data, conn, local_ip, local_port);
}